

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  uint _c;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t _elemsize;
  uint uVar7;
  int i;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  void *pvVar14;
  uint uVar15;
  int _w;
  int iVar16;
  int iVar17;
  int k;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  void *local_178;
  long local_150;
  Mat m;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat local_70;
  
  _c = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    bottom_blob_bordered.elemsize._0_4_ = 0;
    bottom_blob_bordered.elemsize._4_4_ = 0;
    bottom_blob_bordered.elempack = 0;
    bottom_blob_bordered.data = (void *)0x0;
    bottom_blob_bordered.refcount._0_4_ = 0;
    bottom_blob_bordered.refcount._4_4_ = 0;
    bottom_blob_bordered.allocator = (Allocator *)0x0;
    bottom_blob_bordered.dims = 0;
    bottom_blob_bordered.w = 0;
    bottom_blob_bordered.h = 0;
    bottom_blob_bordered.c = 0;
    bottom_blob_bordered.cstep = 0;
    make_padding(this,bottom_blob,&bottom_blob_bordered,opt);
    iVar9 = -100;
    if ((bottom_blob_bordered.data != (void *)0x0) &&
       ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
      iVar10 = bottom_blob_bordered.w;
      iVar6 = bottom_blob_bordered.h;
      iVar4 = (bottom_blob_bordered.w - this->kernel_w) / this->stride_w;
      iVar5 = (bottom_blob_bordered.h - this->kernel_h) / this->stride_h;
      _w = iVar4 + 1;
      Mat::create(top_blob,_w,iVar5 + 1,_c,_elemsize,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar23 = (long)this->kernel_h * (long)this->kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar23,(allocator_type *)&m);
        iVar9 = this->kernel_w;
        iVar8 = iVar10 - iVar9;
        lVar13 = 0;
        iVar16 = 0;
        for (iVar17 = 0; iVar17 < this->kernel_h; iVar17 = iVar17 + 1) {
          for (lVar18 = 0; iVar12 = (int)lVar18, iVar12 < iVar9; lVar18 = lVar18 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar13 + lVar18] = iVar16 + iVar12;
            iVar9 = this->kernel_w;
          }
          iVar16 = iVar16 + iVar8 + iVar12;
          lVar13 = (int)lVar13 + lVar18;
        }
        iVar9 = (int)uVar23;
        if (this->pooling_type == 1) {
          if (this->avgpool_count_include_pad == 0) {
            iVar8 = 0;
            iVar9 = 0;
            if (this->pad_mode == 0) {
              iVar8 = (bottom_blob->w - bottom_blob_bordered.w) + this->pad_left + this->pad_right;
              iVar9 = (bottom_blob->h - bottom_blob_bordered.h) + this->pad_top + this->pad_bottom;
            }
            if ((int)_c < 1) {
              _c = 0;
            }
            for (uVar23 = 0; uVar23 != _c; uVar23 = uVar23 + 1) {
              m.elemsize = CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                    (undefined4)bottom_blob_bordered.elemsize);
              m.data = (void *)(bottom_blob_bordered.cstep * uVar23 * m.elemsize +
                               (long)bottom_blob_bordered.data);
              m.refcount = (int *)0x0;
              m.elempack = bottom_blob_bordered.elempack;
              m.allocator = bottom_blob_bordered.allocator;
              m.dims = 2;
              m.w = bottom_blob_bordered.w;
              m.h = bottom_blob_bordered.h;
              m.c = 1;
              m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              Mat::channel(&local_70,top_blob,(int)uVar23);
              local_178 = local_70.data;
              Mat::~Mat(&local_70);
              iVar16 = this->stride_h;
              local_150 = 0;
              for (lVar13 = 0; lVar13 <= iVar5; lVar13 = lVar13 + 1) {
                iVar17 = this->stride_w;
                uVar15 = this->kernel_h;
                if (this->kernel_h < 1) {
                  uVar15 = 0;
                }
                lVar18 = 0;
                for (lVar21 = 0; lVar21 <= iVar4; lVar21 = lVar21 + 1) {
                  uVar19 = 0;
                  uVar11 = (ulong)(uint)this->kernel_w;
                  if (this->kernel_w < 1) {
                    uVar11 = uVar19;
                  }
                  pvVar14 = (void *)((long)m.w * m.elemsize * local_150 + (long)m.data);
                  fVar24 = 0.0;
                  iVar12 = 0;
                  for (; uVar19 != uVar15; uVar19 = uVar19 + 1) {
                    lVar2 = uVar19 + lVar13 * iVar16;
                    if (this->pad_top <= lVar2) {
                      lVar20 = lVar18;
                      uVar22 = uVar11;
                      if ((iVar9 + iVar6) - this->pad_bottom <= lVar2) break;
                      while (uVar22 != 0) {
                        if (this->pad_left <= lVar20) {
                          if ((iVar8 + iVar10) - this->pad_right <= lVar20) break;
                          fVar24 = fVar24 + *(float *)((long)pvVar14 + lVar20 * 4);
                          iVar12 = iVar12 + 1;
                        }
                        lVar20 = lVar20 + 1;
                        uVar22 = uVar22 - 1;
                      }
                    }
                    pvVar14 = (void *)((long)pvVar14 + (long)m.w * m.elemsize);
                  }
                  *(float *)((long)local_178 + lVar21 * 4) = fVar24 / (float)iVar12;
                  lVar18 = lVar18 + iVar17;
                }
                local_178 = (void *)((long)local_178 + (long)_w * 4);
                local_150 = local_150 + iVar16;
              }
              Mat::~Mat(&m);
            }
          }
          else {
            uVar11 = 0;
            uVar23 = uVar23 & 0xffffffff;
            if (iVar9 < 1) {
              uVar23 = 0;
            }
            if ((int)_c < 1) {
              _c = 0;
            }
            for (; uVar11 != _c; uVar11 = uVar11 + 1) {
              m.elemsize = CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                    (undefined4)bottom_blob_bordered.elemsize);
              m.data = (void *)(bottom_blob_bordered.cstep * uVar11 * m.elemsize +
                               (long)bottom_blob_bordered.data);
              m.refcount = (int *)0x0;
              m.elempack = bottom_blob_bordered.elempack;
              m.allocator = bottom_blob_bordered.allocator;
              m.dims = 2;
              m.w = bottom_blob_bordered.w;
              m.h = bottom_blob_bordered.h;
              m.c = 1;
              m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              Mat::channel(&local_70,top_blob,(int)uVar11);
              pvVar14 = local_70.data;
              Mat::~Mat(&local_70);
              for (iVar10 = 0; iVar10 <= iVar5; iVar10 = iVar10 + 1) {
                iVar6 = this->stride_h;
                iVar8 = this->stride_w;
                for (lVar13 = 0; lVar13 <= iVar4; lVar13 = lVar13 + 1) {
                  fVar24 = 0.0;
                  for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
                    fVar24 = fVar24 + *(float *)((long)m.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar19] * 4 +
                                                lVar13 * iVar8 * 4 +
                                                (long)m.w * (long)iVar10 * (long)iVar6 * m.elemsize)
                    ;
                  }
                  *(float *)((long)pvVar14 + lVar13 * 4) = fVar24 * (1.0 / (float)iVar9);
                }
                pvVar14 = (void *)((long)pvVar14 + (long)_w * 4);
              }
              Mat::~Mat(&m);
            }
          }
        }
        else if (this->pooling_type == 0) {
          uVar11 = 0;
          uVar23 = uVar23 & 0xffffffff;
          if (iVar9 < 1) {
            uVar23 = 0;
          }
          if ((int)_c < 1) {
            _c = 0;
          }
          for (; uVar11 != _c; uVar11 = uVar11 + 1) {
            m.elemsize = CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                  (undefined4)bottom_blob_bordered.elemsize);
            m.data = (void *)(bottom_blob_bordered.cstep * uVar11 * m.elemsize +
                             (long)bottom_blob_bordered.data);
            m.refcount = (int *)0x0;
            m.elempack = bottom_blob_bordered.elempack;
            m.allocator = bottom_blob_bordered.allocator;
            m.dims = 2;
            m.w = bottom_blob_bordered.w;
            m.h = bottom_blob_bordered.h;
            m.c = 1;
            m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            Mat::channel(&local_70,top_blob,(int)uVar11);
            pvVar14 = local_70.data;
            Mat::~Mat(&local_70);
            for (iVar9 = 0; iVar9 <= iVar5; iVar9 = iVar9 + 1) {
              iVar10 = this->stride_h;
              iVar6 = this->stride_w;
              for (lVar13 = 0; lVar13 <= iVar4; lVar13 = lVar13 + 1) {
                pfVar1 = (float *)((long)m.data +
                                  lVar13 * iVar6 * 4 +
                                  (long)m.w * (long)iVar9 * (long)iVar10 * m.elemsize);
                fVar24 = *pfVar1;
                for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
                  fVar3 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar19]];
                  if (fVar24 <= fVar3) {
                    fVar24 = fVar3;
                  }
                }
                *(float *)((long)pvVar14 + lVar13 * 4) = fVar24;
              }
              pvVar14 = (void *)((long)pvVar14 + (long)_w * 4);
            }
            Mat::~Mat(&m);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
        iVar9 = 0;
      }
    }
    Mat::~Mat(&bottom_blob_bordered);
  }
  else {
    iVar4 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    iVar9 = -100;
    Mat::create(top_blob,_c,_elemsize,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar15 = iVar5 * iVar4;
      if (this->pooling_type == 1) {
        uVar7 = uVar15;
        if ((int)uVar15 < 1) {
          uVar7 = 0;
        }
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar23 = 0; uVar23 != _c; uVar23 = uVar23 + 1) {
          Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar23);
          pvVar14 = bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          fVar24 = 0.0;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            fVar24 = fVar24 + *(float *)((long)pvVar14 + uVar11 * 4);
          }
          *(float *)((long)top_blob->data + uVar23 * 4) = fVar24 * (1.0 / (float)(int)uVar15);
        }
      }
      else {
        if (this->pooling_type != 0) {
          return 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar23 = 0; uVar23 != _c; uVar23 = uVar23 + 1) {
          Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar23);
          pvVar14 = bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          fVar24 = *pvVar14;
          for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
            fVar3 = *(float *)((long)pvVar14 + uVar11 * 4);
            if (fVar24 <= fVar3) {
              fVar24 = fVar3;
            }
          }
          *(float *)((long)top_blob->data + uVar23 * 4) = fVar24;
        }
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}